

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteFinalizeJournal(Pager *pPager,int *pRetry,int close_jrnl)

{
  uint uVar1;
  unqlite_file *puVar2;
  SyMemBackend *pBackend;
  int iVar3;
  int iVar4;
  int iVar5;
  uint local_34;
  
  *pRetry = 0;
  iVar3 = pager_lock_db(pPager,4);
  if (iVar3 != 0) {
    *pRetry = 1;
  }
  iVar5 = 0;
  iVar3 = 0;
  if (pPager->no_jrnl == 0) {
    puVar2 = pPager->pjfd;
    if (puVar2 == (unqlite_file *)0x0) {
      iVar3 = -10;
    }
    else {
      uVar1 = pPager->nRec;
      local_34 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      iVar3 = (*puVar2->pMethods->xWrite)(puVar2,&local_34,4,8);
      if ((iVar3 == 0) || (pPager->nRec == 0)) {
        iVar3 = (*pPager->pjfd->pMethods->xSync)(pPager->pjfd,2);
        if (close_jrnl != 0) {
          puVar2 = pPager->pjfd;
          if (puVar2 != (unqlite_file *)0x0) {
            pBackend = pPager->pAllocator;
            iVar4 = (*puVar2->pMethods->xClose)(puVar2);
            SyMemBackendFree(pBackend,puVar2);
            if (iVar4 != 0 && iVar3 != 0) {
              return iVar3;
            }
          }
          pPager->pjfd = (unqlite_file *)0x0;
        }
        iVar3 = iVar5;
        if ((*pRetry == 1) && (iVar5 = pager_lock_db(pPager,4), iVar5 == 0)) {
          *pRetry = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int unqliteFinalizeJournal(Pager *pPager,int *pRetry,int close_jrnl)
{
	int rc;
	*pRetry = 0;
	/* Grab the exclusive lock first */
	rc = pager_lock_db(pPager,EXCLUSIVE_LOCK);
	if( rc != UNQLITE_OK ){
		/* Retry the excusive lock process */
		*pRetry = 1;
		rc = UNQLITE_OK;
	}
	if( pPager->no_jrnl ){
		/* Journaling is omitted, return immediately */
		return UNQLITE_OK;
	}
	if (pPager->pjfd == 0) {
		/* BUGFIX: https://github.com/symisc/unqlite/issues/137 */
		return UNQLITE_ABORT; /* Ongoing operation must be aborted */
	}
	/* Write the total number of database records */
	rc = WriteInt32(pPager->pjfd,pPager->nRec,8 /* sizeof(aJournalRec) */);
	if( rc != UNQLITE_OK ){
		if( pPager->nRec > 0 ){
			return rc;
		}else{
			/* Not so fatal */
			rc = UNQLITE_OK;
		}
	}
	/* Sync the journal and close it */
	rc = unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
	if( close_jrnl ){
		/* close the journal file */
		if( UNQLITE_OK != unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd) ){
			if( rc != UNQLITE_OK /* unqliteOsSync */ ){
				return rc;
			}
		}
		pPager->pjfd = 0;
	}
	if( (*pRetry) == 1 ){
		if( pager_lock_db(pPager,EXCLUSIVE_LOCK) == UNQLITE_OK ){
			/* Got exclusive lock */
			*pRetry = 0;
		}
	}
	return UNQLITE_OK;
}